

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_char_ptr_is_string.hpp
# Opt level: O3

void mserialize::CustomSerializer<const_char_*,_void>::serialize<binlog::detail::QueueWriter>
               (char *str,QueueWriter *ostream)

{
  char *pcVar1;
  size_t sVar2;
  char *data;
  char *__s;
  
  __s = "{null}";
  if (str != (char *)0x0) {
    __s = str;
  }
  sVar2 = strlen(__s);
  *(int *)ostream->_writePos = (int)sVar2;
  pcVar1 = ostream->_writePos;
  ostream->_writePos = pcVar1 + 4;
  if ((int)sVar2 != 0) {
    memcpy(pcVar1 + 4,__s,sVar2 & 0xffffffff);
    ostream->_writePos = ostream->_writePos + (sVar2 & 0xffffffff);
  }
  return;
}

Assistant:

static void serialize(const char* str, OutputStream& ostream)
  {
    mserialize::serialize(view(str), ostream);
  }